

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_string.c
# Opt level: O1

int dwarfstring_append_printf_u(dwarfstring *data,char *format,dwarfstring_u v)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  ulong uVar6;
  size_t slen;
  char *pcVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  char *pcVar11;
  byte bVar12;
  char *pcVar13;
  size_t sVar14;
  long lVar15;
  bool bVar16;
  char *endptr;
  char digbuf [36];
  char *local_60 [5];
  char local_36 [6];
  
  local_60[0] = (char *)0x0;
  if (format == (char *)0x0) {
    pcVar7 = "<DWARFSTRINGERR: null format pointer to dwarfstring_append_printf_u>";
    slen = 0x44;
  }
  else {
    for (sVar14 = 0; (format[sVar14] != '\0' && (format[sVar14] != '%')); sVar14 = sVar14 + 1) {
    }
    dwarfstring_append_length(data,format,sVar14);
    if (format[sVar14] == '%') {
      cVar1 = format[sVar14 + 1];
      if (cVar1 == '-') {
        pcVar7 = 
        "<DWARFSTRINGERR: format - passed to dwarfstring_append_printf_u cannot be handled>";
        slen = 0x52;
      }
      else if ((cVar1 == ' ') || (cVar1 == '\0')) {
        pcVar7 = "<DWARFSTRINGERR: empty percent  to dwarfstring_append_printf_u>";
        slen = 0x3f;
      }
      else {
        lVar15 = sVar14 + 2;
        if (cVar1 != '0') {
          lVar15 = sVar14 + 1;
        }
        uVar6 = strtol(format + lVar15,local_60,10);
        uVar8 = 0;
        if (local_60[0] != format + lVar15) {
          uVar8 = uVar6;
        }
        uVar9 = (ulong)(*local_60[0] == 'l');
        uVar6 = (ulong)((*local_60[0] == 'l') + 1);
        if (local_60[0][uVar9] != 'l') {
          uVar6 = uVar9;
        }
        pcVar11 = local_60[0] + (ulong)(local_60[0][uVar9] == 'l') + (uVar9 - (long)format);
        pcVar7 = pcVar11 + (format[(long)pcVar11] == 'l');
        cVar2 = format[(long)pcVar7];
        pcVar7 = pcVar7 + (cVar2 == 'u');
        cVar3 = format[(long)pcVar7];
        cVar4 = format[(long)(pcVar7 + (cVar3 == 'd'))];
        pcVar7 = pcVar7 + (cVar3 == 'd') + (cVar4 == 'x');
        cVar5 = format[(long)pcVar7];
        if (format[(long)(pcVar7 + (cVar5 == 'X'))] == 's') {
          pcVar7 = 
          "<DWARFSTRINGERR: format percent-s passed to dwarfstring_append_printf_u cannot be handled>"
          ;
          slen = 0x5a;
        }
        else {
          bVar12 = (cVar2 == 'u') + (cVar3 == 'd') + (cVar4 == 'x') + (cVar5 == 'X');
          if (bVar12 < 2) {
            if (bVar12 == 0) {
              pcVar7 = 
              "<DWARFSTRINGERR: format percent x X d u missing to dwarfstring_append_printf_u cannot be handled>"
              ;
              slen = 0x61;
            }
            else if ((int)uVar6 + (uint)(format[(long)pcVar11] == 'l') < 3) {
              if (cVar3 == 'd') {
                pcVar7 = 
                "<DWARFSTRINGERR: format  percent-d to dwarfstring_append_printf_u cannot be handled>"
                ;
                slen = 0x54;
              }
              else {
                pcVar11 = "0123456789ABCDEF";
                if (cVar4 == 'x') {
                  pcVar11 = "0123456789abcdef";
                }
                if (cVar2 == 'u') {
                  pcVar13 = local_36 + 1;
                  local_36[1] = 0;
                  uVar10 = 0;
                  do {
                    uVar6 = v;
                    pcVar13[-1] = "0123456789"[uVar6 % 10];
                    pcVar13 = pcVar13 + -1;
                    uVar10 = uVar10 + 1;
                    v = uVar6 / 10;
                  } while (9 < uVar6);
                  bVar16 = uVar6 < 10;
                }
                else {
                  uVar10 = 0;
                  pcVar13 = local_36 + 2;
                  do {
                    uVar6 = v;
                    pcVar13[-1] = pcVar11[(uint)uVar6 & 0xf];
                    pcVar13 = pcVar13 + -1;
                    uVar10 = uVar10 + 1;
                    v = uVar6 >> 4;
                  } while (0xf < uVar6);
                  bVar16 = uVar6 < 0x10;
                }
                pcVar7 = format + (long)(pcVar7 + (cVar5 == 'X'));
                uVar6 = (ulong)uVar10;
                sVar14 = uVar8 - uVar6;
                if (uVar6 <= uVar8 && sVar14 != 0) {
                  if (cVar1 == '0') {
                    _dwarfstring_append_zeros(data,sVar14);
                  }
                  else {
                    _dwarfstring_append_spaces(data,sVar14);
                  }
                }
                dwarfstring_append_length(data,pcVar13 + ((ulong)bVar16 - 1),uVar6);
                if (*pcVar7 == '\0') {
                  return 0;
                }
                slen = strlen(pcVar7);
              }
            }
            else {
              pcVar7 = 
              "<DWARFSTRINGERR: format percent lll to dwarfstring_append_printf_u cannot be handled>"
              ;
              slen = 0x55;
            }
          }
          else {
            pcVar7 = 
            "<DWARFSTRINGERR: format  percent -x X d u repeats to dwarfstring_append_printf_u cannot be handled>"
            ;
            slen = 99;
          }
        }
      }
    }
    else {
      pcVar7 = "<DWARFSTRINGERR: no percent passed to dwarfstring_append_printf_u>";
      slen = 0x42;
    }
  }
  dwarfstring_append_length(data,pcVar7,slen);
  return 0;
}

Assistant:

int dwarfstring_append_printf_u(dwarfstring *data,
    char *format,
    dwarfstring_u v)
{

    size_t next = 0;
    long val = 0;
    char *endptr = 0;
    const char *numptr = 0;
    size_t fixedlen = 0;
    int leadingzero = 0;
    int lcount = 0;
    int ucount = 0;
    int dcount = 0;
    int xcount = 0;
    int Xcount = 0;
    char *ctable = 0;
    size_t divisor = 0;
    size_t prefixlen = 0;

    if (!format) {
        DWSERR("<DWARFSTRINGERR: null format pointer to "
            "dwarfstring_append_printf_u>");
        return FALSE;
    }
    while (format[next] && format[next] != '%') {
        ++next;
        ++prefixlen;
    }
    dwarfstring_append_length(data,format,prefixlen);
    if (format[next] != '%') {
        /*   No % operator found, we are done */
        DWSERR("<DWARFSTRINGERR: no percent passed to "
            "dwarfstring_append_printf_u>");
        return FALSE;
    }
    next++;
    if (!format[next]) {
        DWSERR("<DWARFSTRINGERR: empty percent  to "
            "dwarfstring_append_printf_u>");
        return FALSE;
    }
    if (format[next] == ' ') {
        DWSERR("<DWARFSTRINGERR: empty percent  to "
            "dwarfstring_append_printf_u>");
        return FALSE;
    }
    if (format[next] == '-') {
        DWSERR("<DWARFSTRINGERR: format - passed to "
            "dwarfstring_append_printf_u "
            "cannot be handled>");
        return FALSE;
    }
    if (format[next] == '0') {
        leadingzero = 1;
        next++;
    }
    numptr = format+next;
    val = strtol(numptr,&endptr,10);
    if ( endptr != numptr) {
        fixedlen = val;
    }
    next = (endptr - format);
    /*  Following is lx lu or u or llx llu , we take
        all this to mean 64 bits, */
#ifdef _WIN32
    if (format[next] == 'I') {
        /*lcount++;*/
        next++;
    }
    if (format[next] == '6') {
        /*lcount++;*/
        next++;
    }
    if (format[next] == '4') {
        /*lcount++;*/
        next++;
    }
#endif /* _WIN32 */
    if (format[next] == 'l') {
        lcount++;
        next++;
    }
    if (format[next] == 'l') {
        lcount++;
        next++;
    }
    if (format[next] == 'l') {
        lcount++;
        next++;
    }
    if (format[next] == 'u') {
        ucount++;
        next++;
    }
    if (format[next] == 'd') {
        dcount++;
        next++;
    }
    if (format[next] == 'x') {
        xcount++;
        next++;
    }
    if (format[next] == 'X') {
        Xcount++;
        next++;
    }
    if (format[next] == 's') {
        DWSERR("<DWARFSTRINGERR: format percent-s passed to "
            "dwarfstring_append_printf_u "
            "cannot be handled>");
        return FALSE;
    }
    if ( (Xcount +xcount+dcount+ucount) > 1) {
        DWSERR("<DWARFSTRINGERR: format  percent -x X d u repeats to "
            "dwarfstring_append_printf_u "
            "cannot be handled>");
        return FALSE;
    }
    if ( (Xcount +xcount+dcount+ucount) == 0) {
        DWSERR("<DWARFSTRINGERR: format percent x X d u missing to "
            "dwarfstring_append_printf_u "
            "cannot be handled>");
        return FALSE;
    }
    if (lcount > 2) {
        DWSERR("<DWARFSTRINGERR: format percent lll to "
            "dwarfstring_append_printf_u "
            "cannot be handled>");
        return FALSE;
    }
    if (dcount > 0) {
        DWSERR("<DWARFSTRINGERR: format  percent-d to "
            "dwarfstring_append_printf_u "
            "cannot be handled>");
        return FALSE;
    }
    if (ucount) {
        divisor = 10;
        ctable = dtable;
    } else {
        divisor = 16;
        if (xcount) {
            ctable = xtable;
        } else {
            ctable = Xtable;
        }
    }
    {
        char digbuf[36];
        char *digptr = 0;
        unsigned digcharlen = 0;
        dwarfstring_u remaining = v;

        if (divisor == 16) {
            digptr = digbuf+sizeof(digbuf) -1;
            for ( ;; ) {
                dwarfstring_u dig;
                dig = remaining & 0xf;
                remaining = remaining >> 4;
                *digptr = ctable[dig];
                ++digcharlen;
                if (!remaining) {
                    break;
                }
                --digptr;
            }
        } else {
            digptr = digbuf+sizeof(digbuf) -1;
            *digptr = 0;
            --digptr;
            for ( ;; ) {
                dwarfstring_u dig;
                dig = remaining % divisor;
                remaining /= divisor;
                *digptr = ctable[dig];
                ++digcharlen;
                if (!remaining) {
                    break;
                }
                --digptr;
            }
        }
        if (fixedlen <= digcharlen) {
            dwarfstring_append_length(data,digptr,digcharlen);
        } else {
            if (!leadingzero) {
                size_t justcount = fixedlen - digcharlen;
                _dwarfstring_append_spaces(data,justcount);
                dwarfstring_append_length(data,digptr,digcharlen);
            } else {
                size_t prefixcount = fixedlen - digcharlen;
                _dwarfstring_append_zeros(data,prefixcount);
                dwarfstring_append_length(data,digptr,digcharlen);
            }
        }
    }
    if (format[next]) {
        size_t trailinglen = strlen(format+next);
        dwarfstring_append_length(data,format+next,trailinglen);
    }
    return FALSE;
}